

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosDynamicBinder.cpp
# Opt level: O0

void __thiscall adios2::helper::DynamicBinder::~DynamicBinder(DynamicBinder *this)

{
  unique_ptr<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  *in_RDI;
  LibraryHandle in_stack_ffffffffffffffe8;
  
  std::
  unique_ptr<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  ::operator->((unique_ptr<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
                *)0x983508);
  adios2sys::DynamicLoader::CloseLibrary(in_stack_ffffffffffffffe8);
  std::
  unique_ptr<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  ::~unique_ptr(in_RDI);
  return;
}

Assistant:

DynamicBinder::~DynamicBinder() { adios2sys::DynamicLoader::CloseLibrary(m_Impl->m_LibraryHandle); }